

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

ssize_t perfetto::base::Base64Decode(char *src,size_t src_size,uint8_t *dst,size_t dst_size)

{
  uint8_t uVar1;
  uint __errnum;
  code *pcVar2;
  ulong uVar3;
  ssize_t sVar4;
  char *fname;
  uint *puVar5;
  char *pcVar6;
  byte bVar7;
  byte *pbVar8;
  uint32_t j;
  ulong uVar9;
  uint8_t d [4];
  char s [4];
  
  if (dst_size < (src_size + 3 >> 2) * 3) {
LAB_00299881:
    sVar4 = -1;
  }
  else {
    pbVar8 = (byte *)(src + src_size);
    s[0] = '\0';
    s[1] = '\0';
    s[2] = '\0';
    s[3] = '\0';
    uVar3 = 0;
    while (src < pbVar8) {
      uVar9 = 0;
      while (uVar9 != 4) {
        if (src < pbVar8) {
          bVar7 = *src;
          src = (char *)((byte *)src + 1);
        }
        else {
          bVar7 = 0x3d;
          if (uVar9 < 2) {
            bVar7 = 0;
          }
        }
        s[uVar9] = bVar7;
        if ((byte)(bVar7 + 0x85) < 0xb0) goto LAB_00299881;
        uVar1 = "N8perfetto8internal20SystemTracingBackendE"[(ulong)bVar7 + 0xd];
        d[uVar9] = uVar1;
        uVar9 = uVar9 + 1;
        if (uVar1 == 0xff) goto LAB_00299881;
      }
      dst[uVar3] = d[1] >> 4 | d[0] << 2;
      dst[uVar3 + 1] = d[2] >> 2 | d[1] << 4;
      dst[uVar3 + 2] = d[2] << 6 | d[3];
      uVar3 = uVar3 + 3;
    }
    if (dst_size < uVar3) {
      fname = Basename(
                      "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                      );
      puVar5 = (uint *)__errno_location();
      __errnum = *puVar5;
      pcVar6 = strerror(__errnum);
      LogMessage(kLogError,fname,0x79c,"%s (errno: %d, %s)","PERFETTO_CHECK(wr_size <= dst_size)",
                 (ulong)__errnum,pcVar6);
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    sVar4 = (uVar3 - (s[3] == '=')) - (ulong)(s[2] == '=');
  }
  return sVar4;
}

Assistant:

inline size_t Base64DecSize(size_t src_size) {
  return (src_size + 3) / 4 * 3;
}